

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_parser.cpp
# Opt level: O0

void __thiscall BmsParser::Parser::WriteLogLine(Parser *this,char *t,...)

{
  ostream *poVar1;
  char local_438 [8];
  char buf [1024];
  va_list vl;
  char *t_local;
  Parser *this_local;
  
  buf[0x3fc] = '0';
  buf[0x3fd] = '\0';
  buf[0x3fe] = '\0';
  buf[0x3ff] = '\0';
  buf[0x3f8] = '\x10';
  buf[0x3f9] = '\0';
  buf[0x3fa] = '\0';
  buf[0x3fb] = '\0';
  memset(local_438,0,0x400);
  vsprintf(local_438,t,buf + 0x3f8);
  poVar1 = std::operator<<((ostream *)&this->log_,local_438);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void Parser::WriteLogLine(const char* t, ...) {
		va_list vl;
		va_start(vl, t);
		char buf[1024] = { 0, };
		vsprintf_s(buf, t, vl);
		log_ << buf << "\n";
#ifdef _DEBUG
		printf("%s\n", buf);
#endif
	}